

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3NodeAddTerm(Fts3Table *p,SegmentNode **ppTree,int isCopyTerm,char *zTerm,int nTerm)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  SegmentNode *local_70;
  SegmentNode *pParent;
  char *zNew;
  int nSuffix;
  int nPrefix;
  int nReq;
  int nData;
  SegmentNode *pNew;
  SegmentNode *pSStack_40;
  int rc;
  SegmentNode *pTree;
  char *pcStack_30;
  int nTerm_local;
  char *zTerm_local;
  SegmentNode **ppSStack_20;
  int isCopyTerm_local;
  SegmentNode **ppTree_local;
  Fts3Table *p_local;
  
  pSStack_40 = *ppTree;
  pTree._4_4_ = nTerm;
  pcStack_30 = zTerm;
  zTerm_local._4_4_ = isCopyTerm;
  ppSStack_20 = ppTree;
  ppTree_local = (SegmentNode **)p;
  if (pSStack_40 != (SegmentNode *)0x0) {
    nSuffix = pSStack_40->nData;
    nPrefix = nSuffix;
    zNew._4_4_ = fts3PrefixCompress(pSStack_40->zTerm,pSStack_40->nTerm,zTerm,nTerm);
    zNew._0_4_ = pTree._4_4_ - zNew._4_4_;
    iVar1 = sqlite3Fts3VarintLen((long)zNew._4_4_);
    iVar2 = sqlite3Fts3VarintLen((long)(int)zNew);
    nSuffix = iVar1 + iVar2 + (int)zNew + nSuffix;
    if ((nSuffix <= *(int *)(ppTree_local + 0x38)) || (pSStack_40->zTerm == (char *)0x0)) {
      if (*(int *)(ppTree_local + 0x38) < nSuffix) {
        pcVar3 = (char *)sqlite3_malloc(nSuffix);
        pSStack_40->aData = pcVar3;
        if (pSStack_40->aData == (char *)0x0) {
          return 7;
        }
      }
      if (pSStack_40->zTerm != (char *)0x0) {
        iVar1 = sqlite3Fts3PutVarint(pSStack_40->aData + nPrefix,(long)zNew._4_4_);
        nPrefix = iVar1 + nPrefix;
      }
      iVar1 = sqlite3Fts3PutVarint(pSStack_40->aData + nPrefix,(long)(int)zNew);
      nPrefix = iVar1 + nPrefix;
      memcpy(pSStack_40->aData + nPrefix,pcStack_30 + zNew._4_4_,(long)(int)zNew);
      pSStack_40->nData = nPrefix + (int)zNew;
      pSStack_40->nEntry = pSStack_40->nEntry + 1;
      if (zTerm_local._4_4_ == 0) {
        pSStack_40->zTerm = pcStack_30;
        pSStack_40->nTerm = pTree._4_4_;
      }
      else {
        if (pSStack_40->nMalloc < pTree._4_4_) {
          pParent = (SegmentNode *)sqlite3_realloc(pSStack_40->zMalloc,pTree._4_4_ << 1);
          if (pParent == (SegmentNode *)0x0) {
            return 7;
          }
          pSStack_40->nMalloc = pTree._4_4_ << 1;
          pSStack_40->zMalloc = (char *)pParent;
        }
        pSStack_40->zTerm = pSStack_40->zMalloc;
        memcpy(pSStack_40->zTerm,pcStack_30,(long)pTree._4_4_);
        pSStack_40->nTerm = pTree._4_4_;
      }
      return 0;
    }
  }
  _nReq = (SegmentNode *)sqlite3_malloc(*(int *)(ppTree_local + 0x38) + 0x48);
  if (_nReq == (SegmentNode *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    memset(_nReq,0,0x48);
    _nReq->nData = 0xb;
    _nReq->aData = (char *)(_nReq + 1);
    if (pSStack_40 == (SegmentNode *)0x0) {
      _nReq->pLeftmost = _nReq;
      pNew._4_4_ = fts3NodeAddTerm((Fts3Table *)ppTree_local,(SegmentNode **)&nReq,zTerm_local._4_4_
                                   ,pcStack_30,pTree._4_4_);
    }
    else {
      local_70 = pSStack_40->pParent;
      pNew._4_4_ = fts3NodeAddTerm((Fts3Table *)ppTree_local,&local_70,zTerm_local._4_4_,pcStack_30,
                                   pTree._4_4_);
      if (pSStack_40->pParent == (SegmentNode *)0x0) {
        pSStack_40->pParent = local_70;
      }
      pSStack_40->pRight = _nReq;
      _nReq->pLeftmost = pSStack_40->pLeftmost;
      _nReq->pParent = local_70;
      _nReq->zMalloc = pSStack_40->zMalloc;
      _nReq->nMalloc = pSStack_40->nMalloc;
      pSStack_40->zMalloc = (char *)0x0;
    }
    *ppSStack_20 = _nReq;
    p_local._4_4_ = pNew._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

static int fts3NodeAddTerm(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode **ppTree,           /* IN/OUT: SegmentNode handle */ 
  int isCopyTerm,                 /* True if zTerm/nTerm is transient */
  const char *zTerm,              /* Pointer to buffer containing term */
  int nTerm                       /* Size of term in bytes */
){
  SegmentNode *pTree = *ppTree;
  int rc;
  SegmentNode *pNew;

  /* First try to append the term to the current node. Return early if 
  ** this is possible.
  */
  if( pTree ){
    int nData = pTree->nData;     /* Current size of node in bytes */
    int nReq = nData;             /* Required space after adding zTerm */
    int nPrefix;                  /* Number of bytes of prefix compression */
    int nSuffix;                  /* Suffix length */

    nPrefix = fts3PrefixCompress(pTree->zTerm, pTree->nTerm, zTerm, nTerm);
    nSuffix = nTerm-nPrefix;

    nReq += sqlite3Fts3VarintLen(nPrefix)+sqlite3Fts3VarintLen(nSuffix)+nSuffix;
    if( nReq<=p->nNodeSize || !pTree->zTerm ){

      if( nReq>p->nNodeSize ){
        /* An unusual case: this is the first term to be added to the node
        ** and the static node buffer (p->nNodeSize bytes) is not large
        ** enough. Use a separately malloced buffer instead This wastes
        ** p->nNodeSize bytes, but since this scenario only comes about when
        ** the database contain two terms that share a prefix of almost 2KB, 
        ** this is not expected to be a serious problem. 
        */
        assert( pTree->aData==(char *)&pTree[1] );
        pTree->aData = (char *)sqlite3_malloc(nReq);
        if( !pTree->aData ){
          return SQLITE_NOMEM;
        }
      }

      if( pTree->zTerm ){
        /* There is no prefix-length field for first term in a node */
        nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nPrefix);
      }

      nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nSuffix);
      memcpy(&pTree->aData[nData], &zTerm[nPrefix], nSuffix);
      pTree->nData = nData + nSuffix;
      pTree->nEntry++;

      if( isCopyTerm ){
        if( pTree->nMalloc<nTerm ){
          char *zNew = sqlite3_realloc(pTree->zMalloc, nTerm*2);
          if( !zNew ){
            return SQLITE_NOMEM;
          }
          pTree->nMalloc = nTerm*2;
          pTree->zMalloc = zNew;
        }
        pTree->zTerm = pTree->zMalloc;
        memcpy(pTree->zTerm, zTerm, nTerm);
        pTree->nTerm = nTerm;
      }else{
        pTree->zTerm = (char *)zTerm;
        pTree->nTerm = nTerm;
      }
      return SQLITE_OK;
    }
  }

  /* If control flows to here, it was not possible to append zTerm to the
  ** current node. Create a new node (a right-sibling of the current node).
  ** If this is the first node in the tree, the term is added to it.
  **
  ** Otherwise, the term is not added to the new node, it is left empty for
  ** now. Instead, the term is inserted into the parent of pTree. If pTree 
  ** has no parent, one is created here.
  */
  pNew = (SegmentNode *)sqlite3_malloc(sizeof(SegmentNode) + p->nNodeSize);
  if( !pNew ){
    return SQLITE_NOMEM;
  }
  memset(pNew, 0, sizeof(SegmentNode));
  pNew->nData = 1 + FTS3_VARINT_MAX;
  pNew->aData = (char *)&pNew[1];

  if( pTree ){
    SegmentNode *pParent = pTree->pParent;
    rc = fts3NodeAddTerm(p, &pParent, isCopyTerm, zTerm, nTerm);
    if( pTree->pParent==0 ){
      pTree->pParent = pParent;
    }
    pTree->pRight = pNew;
    pNew->pLeftmost = pTree->pLeftmost;
    pNew->pParent = pParent;
    pNew->zMalloc = pTree->zMalloc;
    pNew->nMalloc = pTree->nMalloc;
    pTree->zMalloc = 0;
  }else{
    pNew->pLeftmost = pNew;
    rc = fts3NodeAddTerm(p, &pNew, isCopyTerm, zTerm, nTerm); 
  }

  *ppTree = pNew;
  return rc;
}